

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O1

int loader_load_from_configuration(char *path,void **handle,void *allocator)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  size_t size;
  loader_path *paths;
  long lVar6;
  undefined1 *puVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 *puVar10;
  char *pcVar11;
  loader_path *pacVar12;
  long lVar13;
  loader_name config_name;
  loader_path context_path_str;
  loader_path path_base;
  loader_path join_path;
  undefined8 local_3170;
  undefined1 local_3138 [256];
  undefined1 local_3038 [4096];
  undefined1 local_2038 [4096];
  undefined1 local_1038 [4104];
  
  iVar1 = loader_initialize();
  if (iVar1 == 0) {
    sVar2 = strnlen(path,0x1000);
    lVar3 = portability_path_get_name(path,sVar2 + 1,local_3138,0xff);
    if (lVar3 == 0) {
      pcVar11 = "Loader load from configuration invalid config name (%s)";
      uVar8 = 0x19a;
    }
    else {
      lVar3 = configuration_create(local_3138,path,0,allocator);
      if (lVar3 != 0) {
        lVar4 = configuration_value_type(lVar3,"language_id",7);
        if (lVar4 == 0) {
          pcVar11 = "Loader load from configuration invalid tag (%s)";
          uVar8 = 0x1ac;
        }
        else {
          lVar5 = configuration_value_type(lVar3,"scripts",9);
          if (lVar5 == 0) {
            pcVar11 = "Loader load from configuration invalid scripts (%s)";
            uVar8 = 0x1b7;
          }
          else {
            size = value_type_count(lVar5);
            if (size == 0) {
              pcVar11 = "Loader load from configuration cannot load zero scripts";
              uVar8 = 0x1c2;
            }
            else {
              paths = (loader_path *)malloc(size << 0xc);
              if (paths != (loader_path *)0x0) {
                lVar6 = configuration_value_type(lVar3,"path",7);
                if (lVar6 == 0) {
                  local_3170 = 0;
                }
                else {
                  puVar7 = (undefined1 *)value_to_string(lVar6);
                  uVar8 = value_type_size(lVar6);
                  iVar1 = portability_path_is_absolute(puVar7,uVar8);
                  if (iVar1 != 0) {
                    sVar2 = strnlen(path,0x1000);
                    uVar9 = portability_path_get_directory(path,sVar2 + 1,local_2038,0x1000);
                    uVar8 = portability_path_join(local_2038,uVar9,puVar7,uVar8,local_1038,0x1000);
                    puVar7 = local_1038;
                  }
                  local_3170 = portability_path_canonical(puVar7,uVar8,local_3038,0x1000);
                }
                lVar5 = value_to_array(lVar5);
                lVar13 = 0;
                pacVar12 = paths;
                do {
                  if (*(long *)(lVar5 + lVar13 * 8) != 0) {
                    puVar10 = (undefined1 *)value_to_string();
                    uVar8 = value_type_size(*(undefined8 *)(lVar5 + lVar13 * 8));
                    puVar7 = puVar10;
                    if (lVar6 != 0) {
                      puVar7 = local_2038;
                      uVar8 = portability_path_join
                                        (local_3038,local_3170,puVar10,uVar8,puVar7,0x1000);
                    }
                    portability_path_canonical(puVar7,uVar8,pacVar12,0x1000);
                  }
                  lVar13 = lVar13 + 1;
                  pacVar12 = pacVar12 + 1;
                } while (size + (size == 0) != lVar13);
                pcVar11 = (char *)value_to_string(lVar4);
                iVar1 = loader_load_from_file(pcVar11,paths,size,handle);
                if (iVar1 != 0) {
                  log_write_impl_va("metacall",0x207,"loader_load_from_configuration",
                                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                                    ,3,"Loader load from configuration invalid load from file");
                  configuration_clear(lVar3);
                  free(paths);
                  return 1;
                }
                configuration_clear(lVar3);
                free(paths);
                return 0;
              }
              pcVar11 = "Loader load from configuration invalid paths allocation";
              uVar8 = 0x1cd;
            }
          }
        }
        log_write_impl_va("metacall",uVar8,"loader_load_from_configuration",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                          ,3,pcVar11);
        configuration_clear(lVar3);
        return 1;
      }
      pcVar11 = "Loader load from configuration invalid initialization (%s)";
      uVar8 = 0x1a3;
    }
    log_write_impl_va("metacall",uVar8,"loader_load_from_configuration",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                      ,3,pcVar11,path);
  }
  return 1;
}

Assistant:

int loader_load_from_configuration(const loader_path path, void **handle, void *allocator)
{
	loader_name config_name;
	configuration config;
	value tag, scripts, context_path;
	value *scripts_array;
	loader_path *paths;
	loader_path context_path_str;
	size_t context_path_size = 0;
	size_t iterator, size;

	if (loader_initialize() == 1)
	{
		return 1;
	}

	if (portability_path_get_name(path, strnlen(path, LOADER_PATH_SIZE) + 1, config_name, LOADER_NAME_SIZE) == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid config name (%s)", path);

		return 1;
	}

	config = configuration_create(config_name, path, NULL, allocator);

	if (config == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid initialization (%s)", path);

		return 1;
	}

	tag = configuration_value_type(config, "language_id", TYPE_STRING);

	if (tag == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid tag (%s)", path);

		configuration_clear(config);

		return 1;
	}

	scripts = configuration_value_type(config, "scripts", TYPE_ARRAY);

	if (scripts == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid scripts (%s)", path);

		configuration_clear(config);

		return 1;
	}

	size = value_type_count(scripts);

	if (size == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration cannot load zero scripts");

		configuration_clear(config);

		return 1;
	}

	paths = malloc(sizeof(loader_path) * size);

	if (paths == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid paths allocation");

		configuration_clear(config);

		return 1;
	}

	context_path = configuration_value_type(config, "path", TYPE_STRING);

	if (context_path != NULL)
	{
		const char *str = value_to_string(context_path);

		size_t str_size = value_type_size(context_path);

		if (portability_path_is_absolute(str, str_size) == 0)
		{
			context_path_size = portability_path_canonical(str, str_size, context_path_str, LOADER_PATH_SIZE);
		}
		else
		{
			loader_path path_base, join_path;

			size_t path_base_size = portability_path_get_directory(path, strnlen(path, LOADER_PATH_SIZE) + 1, path_base, LOADER_PATH_SIZE);

			size_t join_path_size = portability_path_join(path_base, path_base_size, str, str_size, join_path, LOADER_PATH_SIZE);

			context_path_size = portability_path_canonical(join_path, join_path_size, context_path_str, LOADER_PATH_SIZE);
		}
	}

	scripts_array = value_to_array(scripts);

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (scripts_array[iterator] != NULL)
		{
			const char *str = value_to_string(scripts_array[iterator]);

			size_t str_size = value_type_size(scripts_array[iterator]);

			if (context_path == NULL)
			{
				(void)portability_path_canonical(str, str_size, paths[iterator], LOADER_PATH_SIZE);
			}
			else
			{
				loader_path join_path;

				size_t join_path_size = portability_path_join(context_path_str, context_path_size, str, str_size, join_path, LOADER_PATH_SIZE);

				(void)portability_path_canonical(join_path, join_path_size, paths[iterator], LOADER_PATH_SIZE);
			}
		}
	}

	if (loader_load_from_file((const char *)value_to_string(tag), (const loader_path *)paths, size, handle) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader load from configuration invalid load from file");

		configuration_clear(config);

		free(paths);

		return 1;
	}

	configuration_clear(config);

	free(paths);

	return 0;
}